

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O1

void __thiscall
IntrusiveList<VariableHandle>::push_back(IntrusiveList<VariableHandle> *this,VariableHandle *node)

{
  VariableHandle **ppVVar1;
  bool bVar2;
  
  if (node == (VariableHandle *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
  }
  if (node->next == (VariableHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (VariableHandle *)0x0;
      ppVVar1 = &this->tail->next;
      if (!bVar2) {
        ppVVar1 = &this->tail;
      }
      *ppVVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}